

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O3

VRRStep * __thiscall
OSTEI_VRR_Algorithm_Base::Create_Single_
          (VRRStep *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,Quartet *q,
          RRStepType rrstep)

{
  array<int,_4UL> *paVar1;
  int *piVar2;
  Quartet *this_00;
  bool bVar3;
  long lVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  
  (*this->_vptr_OSTEI_VRR_Algorithm_Base[2])();
  uVar6 = (__return_storage_ptr__->xyz != STEP_Y) + 1;
  if (__return_storage_ptr__->xyz == STEP_X) {
    uVar6 = 0;
  }
  uVar7 = (ulong)uVar6;
  paVar1 = &__return_storage_ptr__->ijkl;
  piVar5 = (__return_storage_ptr__->ijkl)._M_elems + 1;
  piVar2 = (__return_storage_ptr__->ijkl)._M_elems + 3;
  (__return_storage_ptr__->ijkl)._M_elems[0] = 0;
  (__return_storage_ptr__->ijkl)._M_elems[1] = 0;
  (__return_storage_ptr__->ijkl)._M_elems[2] = 0;
  (__return_storage_ptr__->ijkl)._M_elems[3] = 0;
  this_00 = (__return_storage_ptr__->src)._M_elems + 2;
  if (rrstep == K) {
    bVar3 = Quartet::operator_cast_to_bool(this_00);
    if (bVar3) {
LAB_0010df9d:
      (__return_storage_ptr__->ijkl)._M_elems[2] = (q->ket).left.ijk._M_elems[uVar7] + -1;
    }
    else {
      bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 3);
      if (bVar3) goto LAB_0010df9d;
    }
    bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 4);
    if (bVar3) {
LAB_0010dfcd:
      *piVar2 = (q->ket).right.ijk._M_elems[uVar7];
    }
    else {
      bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 5);
      if (bVar3) goto LAB_0010dfcd;
    }
    bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 6);
    if (bVar3) {
      paVar1->_M_elems[0] = (q->bra).left.ijk._M_elems[uVar7];
    }
    bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 7);
LAB_0010e07a:
    lVar4 = 0x10;
  }
  else {
    if (rrstep == J) {
      bVar3 = Quartet::operator_cast_to_bool(this_00);
      if (bVar3) {
LAB_0010df14:
        paVar1->_M_elems[0] = (q->bra).left.ijk._M_elems[uVar7];
      }
      else {
        bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 3);
        if (bVar3) goto LAB_0010df14;
      }
      bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 4);
      if (bVar3) {
LAB_0010df40:
        *piVar5 = (q->bra).right.ijk._M_elems[uVar7] + -1;
      }
      else {
        bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 5);
        if (bVar3) goto LAB_0010df40;
      }
      bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 6);
      if (bVar3) {
        (__return_storage_ptr__->ijkl)._M_elems[2] = (q->ket).left.ijk._M_elems[uVar7];
      }
      bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 7);
    }
    else {
      if (rrstep != I) {
        bVar3 = Quartet::operator_cast_to_bool(this_00);
        if (bVar3) {
LAB_0010e01f:
          (__return_storage_ptr__->ijkl)._M_elems[2] = (q->ket).left.ijk._M_elems[uVar7];
        }
        else {
          bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 3);
          if (bVar3) goto LAB_0010e01f;
        }
        bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 4);
        if (bVar3) {
LAB_0010e04a:
          *piVar2 = (q->ket).right.ijk._M_elems[uVar7] + -1;
        }
        else {
          bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 5);
          if (bVar3) goto LAB_0010e04a;
        }
        bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 6);
        if (bVar3) {
          paVar1->_M_elems[0] = (q->bra).left.ijk._M_elems[uVar7];
        }
        bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 7);
        goto LAB_0010e07a;
      }
      bVar3 = Quartet::operator_cast_to_bool(this_00);
      if (bVar3) {
LAB_0010de93:
        paVar1->_M_elems[0] = (q->bra).left.ijk._M_elems[uVar7] + -1;
      }
      else {
        bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 3);
        if (bVar3) goto LAB_0010de93;
      }
      bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 4);
      if (bVar3) {
LAB_0010dec1:
        *piVar5 = (q->bra).right.ijk._M_elems[uVar7];
      }
      else {
        bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 5);
        if (bVar3) goto LAB_0010dec1;
      }
      bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 6);
      if (bVar3) {
        (__return_storage_ptr__->ijkl)._M_elems[2] = (q->ket).left.ijk._M_elems[uVar7];
      }
      bVar3 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 7);
    }
    lVar4 = 0x50;
    piVar5 = piVar2;
  }
  if (bVar3 != false) {
    *piVar5 = *(int *)((long)(q->bra).left.ijk._M_elems + uVar7 * 4 + lVar4 + -4);
  }
  return __return_storage_ptr__;
}

Assistant:

VRRStep OSTEI_VRR_Algorithm_Base::Create_Single_(Quartet q, RRStepType rrstep)
{
    VRRStep vs = VRRStep_(q, rrstep);

    // fill in the ijkl members
    int istep = XYZStepToIdx(vs.xyz);
    vs.ijkl = {0, 0, 0, 0};
    if(rrstep == RRStepType::I)
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[0] = q.bra.left.ijk[istep]-1;
        if(vs.src[4] || vs.src[5])
            vs.ijkl[1] = q.bra.right.ijk[istep];
        if(vs.src[6])
            vs.ijkl[2] = q.ket.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[3] = q.ket.right.ijk[istep];
    }
    else if(rrstep == RRStepType::J)
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[0] = q.bra.left.ijk[istep];
        if(vs.src[4] || vs.src[5])
            vs.ijkl[1] = q.bra.right.ijk[istep]-1;
        if(vs.src[6])
            vs.ijkl[2] = q.ket.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[3] = q.ket.right.ijk[istep];
    }
    else if(rrstep == RRStepType::K)
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[2] = q.ket.left.ijk[istep]-1;
        if(vs.src[4] || vs.src[5])
            vs.ijkl[3] = q.ket.right.ijk[istep];
        if(vs.src[6])
            vs.ijkl[0] = q.bra.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[1] = q.bra.right.ijk[istep];
    }
    else
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[2] = q.ket.left.ijk[istep];
        if(vs.src[4] || vs.src[5])
            vs.ijkl[3] = q.ket.right.ijk[istep]-1;
        if(vs.src[6])
            vs.ijkl[0] = q.bra.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[1] = q.bra.right.ijk[istep];
    }

    return vs;
}